

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_run_mode.h
# Opt level: O3

int32_t __thiscall charls::context_run_mode::get_golomb_code(context_run_mode *this)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  bVar1 = this->n_;
  uVar3 = (uint)bVar1;
  iVar4 = (uint)(bVar1 >> 1) * this->run_interruption_type_ + this->a_;
  iVar2 = 0;
  if ((int)(uint)bVar1 < iVar4) {
    iVar2 = 0;
    do {
      if (iVar2 == -0x21) {
        __assert_fail("k <= 32",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/context_run_mode.h"
                      ,0x2a,"int32_t charls::context_run_mode::get_golomb_code() const");
      }
      uVar3 = uVar3 * 2;
      iVar2 = iVar2 + -1;
    } while ((int)uVar3 < iVar4);
    iVar2 = -iVar2;
  }
  return iVar2;
}

Assistant:

FORCE_INLINE int32_t get_golomb_code() const noexcept
    {
        const int32_t temp{a_ + (n_ >> 1) * run_interruption_type_};
        int32_t n_test{n_};
        int32_t k{};
        for (; n_test < temp; ++k)
        {
            n_test <<= 1;
            ASSERT(k <= 32);
        }
        return k;
    }